

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  bool bVar1;
  byte bVar2;
  HandlerResponse HVar3;
  uint uVar4;
  ostream *poVar5;
  ssize_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  bool local_58a;
  byte local_55a;
  bool local_52b;
  bool local_52a;
  bool local_4b9;
  bool local_4a9;
  bool ret;
  string *data;
  char *local_498;
  undefined1 local_490 [8];
  BufferStream bstrm;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  stringstream local_2b0 [8];
  stringstream ss;
  ostream local_2a0 [383];
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  undefined1 local_80 [8];
  string boundary;
  string content_type;
  bool need_apply_ranges_local;
  Response *res_local;
  Request *req_local;
  bool close_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  if (res->status != -1) {
    content_type.field_2._M_local_buf[0xf] = need_apply_ranges;
    if (((399 < res->status) &&
        (bVar1 = std::function::operator_cast_to_bool((function *)&this->error_handler_), bVar1)) &&
       (HVar3 = std::
                function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
                ::operator()(&this->error_handler_,req,res), HVar3 == Handled)) {
      content_type.field_2._M_local_buf[0xf] = '\x01';
    }
    std::__cxx11::string::string((string *)(boundary.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_80);
    if ((content_type.field_2._M_local_buf[0xf] & 1U) != 0) {
      apply_ranges(this,req,res,(string *)((long)&boundary.field_2 + 8),(string *)local_80);
    }
    local_d2 = 0;
    local_d3 = 0;
    local_d4 = 0;
    local_4b9 = true;
    if (!close_connection) {
      std::allocator<char>::allocator();
      local_d2 = 1;
      std::__cxx11::string::string((string *)&local_d0,"Connection",&local_d1);
      local_d3 = 1;
      Request::get_header_value(&local_b0,req,&local_d0,0);
      local_d4 = 1;
      local_4b9 = std::operator==(&local_b0,"close");
    }
    if ((local_d4 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((local_d3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if ((local_d2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if (local_4b9 == false) {
      std::__cxx11::stringstream::stringstream(local_2b0);
      poVar5 = std::operator<<(local_2a0,"timeout=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->keep_alive_timeout_sec_);
      poVar5 = std::operator<<(poVar5,", max=");
      std::ostream::operator<<(poVar5,this->keep_alive_max_count_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,"Keep-Alive",&local_2d1);
      std::__cxx11::stringstream::str();
      Response::set_header(res,&local_2d0,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::stringstream::~stringstream(local_2b0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"Connection",&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,"close",&local_121);
      Response::set_header(res,&local_f8,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"Content-Type",&local_319);
    bVar1 = Response::has_header(res,&local_318);
    local_52a = false;
    if (!bVar1) {
      bVar2 = std::__cxx11::string::empty();
      local_52b = true;
      if (((bVar2 & 1) != 0) && (local_52b = true, res->content_length_ == 0)) {
        local_52b = std::function::operator_cast_to_bool((function *)&res->content_provider_);
      }
      local_52a = local_52b;
    }
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    if (local_52a != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"Content-Type",&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,"text/plain",&local_369);
      Response::set_header(res,&local_340,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"Content-Length",&local_391);
    bVar1 = Response::has_header(res,&local_390);
    local_55a = 0;
    if (!bVar1) {
      uVar4 = std::__cxx11::string::empty();
      local_55a = 0;
      if (((uVar4 & 1) != 0) && (local_55a = 0, res->content_length_ == 0)) {
        bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_);
        local_55a = bVar1 ^ 0xff;
      }
    }
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    if ((local_55a & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b8,"Content-Length",&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e0,"0",&local_3e1);
      Response::set_header(res,&local_3b8,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"Accept-Ranges",&local_409);
    bVar1 = Response::has_header(res,&local_408);
    local_58a = false;
    if (!bVar1) {
      local_58a = std::operator==(&req->method,"HEAD");
    }
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    if (local_58a != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_430,"Accept-Ranges",&local_431);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"bytes",(allocator *)((long)&bstrm.position + 7));
      Response::set_header(res,&local_430,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bstrm.position + 7));
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->post_routing_handler_);
    if (bVar1) {
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                (&this->post_routing_handler_,req,res);
    }
    detail::BufferStream::BufferStream((BufferStream *)local_490);
    local_498 = detail::status_message(res->status);
    sVar6 = Stream::write_format<int,char_const*>
                      ((Stream *)local_490,"HTTP/1.1 %d %s\r\n",&res->status,&local_498);
    if (sVar6 == 0) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      sVar6 = detail::write_headers((Stream *)local_490,&res->headers);
      if (sVar6 == 0) {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        detail::BufferStream::get_buffer_abi_cxx11_((BufferStream *)local_490);
        pcVar8 = (char *)std::__cxx11::string::data();
        sVar9 = std::__cxx11::string::size();
        detail::write_data(strm,pcVar8,sVar9);
        bVar1 = false;
      }
    }
    detail::BufferStream::~BufferStream((BufferStream *)local_490);
    if (!bVar1) {
      local_4a9 = true;
      bVar1 = std::operator!=(&req->method,"HEAD");
      if (bVar1) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar8 = (char *)std::__cxx11::string::data();
          sVar9 = std::__cxx11::string::size();
          local_4a9 = detail::write_data(strm,pcVar8,sVar9);
        }
        else {
          bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_);
          if (bVar1) {
            local_4a9 = write_content_with_provider
                                  (this,strm,req,res,(string *)local_80,
                                   (string *)((long)&boundary.field_2 + 8));
            if (local_4a9) {
              res->content_provider_success_ = true;
            }
            else {
              res->content_provider_success_ = false;
            }
          }
        }
      }
      bVar1 = std::function::operator_cast_to_bool((function *)&this->logger_);
      if (bVar1) {
        std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                  (&this->logger_,req,res);
      }
      this_local._7_1_ = local_4a9;
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("res.status != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                ,0x155d,
                "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
               );
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}